

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc.c
# Opt level: O0

void VP8LSubtractGreenFromBlueAndRed_C(uint32_t *argb_data,int num_pixels)

{
  uint uVar1;
  uint uVar2;
  uint32_t new_b;
  uint32_t new_r;
  int green;
  int argb;
  int i;
  int num_pixels_local;
  uint32_t *argb_data_local;
  
  for (i = 0; i < num_pixels; i = i + 1) {
    uVar1 = argb_data[i];
    uVar2 = (int)uVar1 >> 8 & 0xff;
    argb_data[i] = uVar1 & 0xff00ff00 | (((int)uVar1 >> 0x10 & 0xffU) - uVar2 & 0xff) << 0x10 |
                   (uVar1 & 0xff) - uVar2 & 0xff;
  }
  return;
}

Assistant:

void VP8LSubtractGreenFromBlueAndRed_C(uint32_t* argb_data, int num_pixels) {
  int i;
  for (i = 0; i < num_pixels; ++i) {
    const int argb = argb_data[i];
    const int green = (argb >> 8) & 0xff;
    const uint32_t new_r = (((argb >> 16) & 0xff) - green) & 0xff;
    const uint32_t new_b = (((argb >>  0) & 0xff) - green) & 0xff;
    argb_data[i] = (argb & 0xff00ff00u) | (new_r << 16) | new_b;
  }
}